

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

cio_error epoll_mod(cio_eventloop *loop,cio_event_notifier *evn,uint32_t events)

{
  int iVar1;
  int *piVar2;
  undefined1 local_30 [8];
  epoll_event epoll_ev;
  uint32_t events_local;
  cio_event_notifier *evn_local;
  cio_eventloop *loop_local;
  
  local_30._0_4_ = events;
  unique0x1000006c = evn;
  epoll_ev.data.u32 = events;
  unique0x10000078 = evn;
  iVar1 = epoll_ctl(loop->epoll_fd,3,evn->fd,(epoll_event *)local_30);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    loop_local._4_4_ = -*piVar2;
  }
  else {
    loop_local._4_4_ = CIO_SUCCESS;
  }
  return loop_local._4_4_;
}

Assistant:

static enum cio_error epoll_mod(const struct cio_eventloop *loop, struct cio_event_notifier *evn, uint32_t events)
{
	struct epoll_event epoll_ev;

	epoll_ev.data.ptr = evn;
	epoll_ev.events = events;
	if (cio_unlikely(epoll_ctl(loop->epoll_fd, EPOLL_CTL_MOD, evn->fd, &epoll_ev) < 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}